

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  string *this;
  error_code eVar2;
  path base;
  path pStack_f8;
  path local_d8;
  path local_b8;
  path local_98;
  path local_78;
  path local_58;
  path local_38;
  
  this = (string *)&pStack_f8;
  std::error_code::clear(ec);
  current_path(&local_d8,ec);
  if (ec->_M_value != 0) {
    eVar2 = detail::make_system_error(0);
    ec->_M_value = eVar2._M_value;
    ec->_M_cat = eVar2._M_cat;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_0014b49c;
  }
  if ((p->_path)._M_string_length == 0) {
LAB_0014b3c4:
    operator/(__return_storage_ptr__,&local_d8,p);
  }
  else {
    bVar1 = path::has_root_name(p);
    if (bVar1) {
      bVar1 = path::has_root_directory(p);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)p);
        goto LAB_0014b49c;
      }
      path::root_name(&local_58,p);
      path::root_directory(&local_78,&local_d8);
      operator/(&local_38,&local_58,&local_78);
      path::relative_path(&local_98,&local_d8);
      operator/(&pStack_f8,&local_38,&local_98);
      path::relative_path(&local_b8,p);
      operator/(__return_storage_ptr__,&pStack_f8,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&pStack_f8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      this = (string *)&local_58;
    }
    else {
      bVar1 = path::has_root_directory(p);
      if (!bVar1) goto LAB_0014b3c4;
      path::root_name(&pStack_f8,&local_d8);
      operator/(__return_storage_ptr__,&pStack_f8,p);
    }
    std::__cxx11::string::~string(this);
  }
LAB_0014b49c:
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(p.wstring().c_str(), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(p.wstring().c_str(), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}